

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::RunContext::sectionEnded
          (RunContext *this,SectionInfo *info,Counts *prevAssertions,double _durationInSeconds)

{
  IStreamingReporter *pIVar1;
  char cVar2;
  bool _missingAssertions;
  Counts assertions;
  SectionStats local_e0;
  Counts local_48;
  
  cVar2 = std::uncaught_exception();
  if (cVar2 == '\0') {
    local_48.passed = (this->m_totals).assertions.passed - prevAssertions->passed;
    local_48.failed = (this->m_totals).assertions.failed - prevAssertions->failed;
    local_48.failedButOk = (this->m_totals).assertions.failedButOk - prevAssertions->failedButOk;
    _missingAssertions = testForMissingAssertions(this,&local_48);
    SectionTracking::TestCaseTracker::leaveSection((this->m_testCaseTracker).nullableValue);
    pIVar1 = (this->m_reporter).m_p;
    SectionStats::SectionStats(&local_e0,info,&local_48,_durationInSeconds,_missingAssertions);
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar1,&local_e0);
    SectionStats::~SectionStats(&local_e0);
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
              (&this->m_messages,
               (this->m_messages).
               super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  else {
    UnfinishedSections::UnfinishedSections
              ((UnfinishedSections *)&local_e0,info,prevAssertions,_durationInSeconds);
    std::
    vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
    ::emplace_back<Catch::RunContext::UnfinishedSections>
              (&this->m_unfinishedSections,(UnfinishedSections *)&local_e0);
    if ((size_type *)local_e0.sectionInfo.description.field_2._8_8_ !=
        &local_e0.sectionInfo.lineInfo.file._M_string_length) {
      operator_delete((void *)local_e0.sectionInfo.description.field_2._8_8_);
    }
    if ((size_type *)local_e0.sectionInfo.name.field_2._8_8_ !=
        &local_e0.sectionInfo.description._M_string_length) {
      operator_delete((void *)local_e0.sectionInfo.name.field_2._8_8_);
    }
    if (local_e0._vptr_SectionStats != (_func_int **)&local_e0.sectionInfo.name._M_string_length) {
      operator_delete(local_e0._vptr_SectionStats);
    }
  }
  return;
}

Assistant:

virtual void sectionEnded( SectionInfo const& info, Counts const& prevAssertions, double _durationInSeconds ) {
            if( std::uncaught_exception() ) {
                m_unfinishedSections.push_back( UnfinishedSections( info, prevAssertions, _durationInSeconds ) );
                return;
            }

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            m_testCaseTracker->leaveSection();

            m_reporter->sectionEnded( SectionStats( info, assertions, _durationInSeconds, missingAssertions ) );
            m_messages.clear();
        }